

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.c
# Opt level: O0

za_file * coda_za_open(char *filename,_func_void_char_ptr_varargs *error_handler)

{
  _func_void_char_ptr_varargs *p_Var1;
  __syscall_slong_t _Var2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ssize_t sVar6;
  hashtable *phVar7;
  char local_ba;
  char local_b9;
  int open_flags;
  char buffer [2];
  za_file *zf;
  stat statbuf;
  _func_void_char_ptr_varargs *error_handler_local;
  char *filename_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)error_handler;
  iVar3 = stat(filename,(stat *)&zf);
  if (iVar3 == 0) {
    if (((uint)statbuf.st_nlink & 0x8000) == 0) {
      (*(code *)statbuf.__glibc_reserved[2])("could not open %s (not a regular file)",filename);
      filename_local = (char *)0x0;
    }
    else if ((long)statbuf.st_rdev < 0x16) {
      (*(code *)statbuf.__glibc_reserved[2])("could not open %s (not a zip file)",filename);
      filename_local = (char *)0x0;
    }
    else {
      _open_flags = (za_file *)malloc(0x30);
      if (_open_flags == (za_file *)0x0) {
        if (statbuf.__glibc_reserved[2] != 0) {
          (*(code *)statbuf.__glibc_reserved[2])("could not allocate %ld bytes",0x30);
        }
        filename_local = (char *)0x0;
      }
      else {
        pcVar5 = strdup(filename);
        _open_flags->filename = pcVar5;
        if (_open_flags->filename == (char *)0x0) {
          free(_open_flags);
          if (statbuf.__glibc_reserved[2] != 0) {
            (*(code *)statbuf.__glibc_reserved[2])("could not duplicate string");
          }
          filename_local = (char *)0x0;
        }
        else {
          _open_flags->file_size = statbuf.st_rdev;
          _open_flags->num_entries = 0;
          _open_flags->entry = (za_entry *)0x0;
          _open_flags->hash_data = (hashtable *)0x0;
          if (statbuf.__glibc_reserved[2] == 0) {
            _open_flags->handle_error = default_error_handler;
          }
          else {
            _open_flags->handle_error = (_func_void_char_ptr_varargs *)statbuf.__glibc_reserved[2];
          }
          iVar3 = open(filename,0);
          _open_flags->fd = iVar3;
          if (_open_flags->fd < 0) {
            p_Var1 = _open_flags->handle_error;
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            (*p_Var1)("could not open file \'%s\' (%s)\n",filename,pcVar5);
            free(_open_flags->filename);
            free(_open_flags);
            filename_local = (char *)0x0;
          }
          else {
            sVar6 = read(_open_flags->fd,&local_ba,2);
            if (sVar6 < 0) {
              p_Var1 = _open_flags->handle_error;
              piVar4 = __errno_location();
              pcVar5 = strerror(*piVar4);
              (*p_Var1)(pcVar5);
              coda_za_close(_open_flags);
              filename_local = (char *)0x0;
            }
            else if ((local_ba == 'P') && (local_b9 == 'K')) {
              phVar7 = coda_hashtable_new(1);
              _open_flags->hash_data = phVar7;
              iVar3 = get_entries(_open_flags);
              if (iVar3 == 0) {
                filename_local = (char *)_open_flags;
              }
              else {
                coda_za_close(_open_flags);
                filename_local = (char *)0x0;
              }
            }
            else {
              (*(code *)statbuf.__glibc_reserved[2])("could not open %s (not a zip file)",filename);
              coda_za_close(_open_flags);
              filename_local = (char *)0x0;
            }
          }
        }
      }
    }
  }
  else {
    piVar4 = __errno_location();
    _Var2 = statbuf.__glibc_reserved[2];
    if (*piVar4 == 2) {
      (*(code *)statbuf.__glibc_reserved[2])("could not find %s",filename);
    }
    else {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      (*(code *)_Var2)("could not open %s (%s)",filename,pcVar5);
    }
    filename_local = (char *)0x0;
  }
  return (za_file *)filename_local;
}

Assistant:

za_file *za_open(const char *filename, void (*error_handler)(const char *, ...))
{
    struct stat statbuf;
    za_file *zf;
    char buffer[2];
    int open_flags;

    if (stat(filename, &statbuf) != 0)
    {
        if (errno == ENOENT)
        {
            error_handler("could not find %s", filename);
        }
        else
        {
            error_handler("could not open %s (%s)", filename, strerror(errno));
        }
        return NULL;
    }
    if ((statbuf.st_mode & S_IFREG) == 0)
    {
        error_handler("could not open %s (not a regular file)", filename);
        return NULL;
    }
    if (statbuf.st_size < 22)
    {
        error_handler("could not open %s (not a zip file)", filename);
        return NULL;
    }

    zf = malloc(sizeof(za_file));
    if (zf == NULL)
    {
        if (error_handler != NULL)
        {
            error_handler("could not allocate %ld bytes", sizeof(za_file));
        }
        return NULL;
    }
    zf->filename = strdup(filename);
    if (zf->filename == NULL)
    {
        free(zf);
        if (error_handler != NULL)
        {
            error_handler("could not duplicate string");
        }
        return NULL;
    }
    zf->file_size = statbuf.st_size;
    zf->num_entries = 0;
    zf->entry = NULL;
    zf->hash_data = NULL;
    if (error_handler != NULL)
    {
        zf->handle_error = error_handler;
    }
    else
    {
        zf->handle_error = default_error_handler;
    }

    open_flags = O_RDONLY;
#ifdef WIN32
    open_flags |= _O_BINARY;
#endif
    zf->fd = open(filename, open_flags);
    if (zf->fd < 0)
    {
        zf->handle_error("could not open file '%s' (%s)\n", filename, strerror(errno));
        free(zf->filename);
        free(zf);
        return NULL;
    }

    if (read(zf->fd, buffer, 2) < 0)
    {
        zf->handle_error(strerror(errno));
        za_close(zf);
        return NULL;
    }
    if (buffer[0] != 'P' || buffer[1] != 'K')
    {
        error_handler("could not open %s (not a zip file)", filename);
        za_close(zf);
        return NULL;
    }

    zf->hash_data = hashtable_new(1);
    if (get_entries(zf) != 0)
    {
        za_close(zf);
        return NULL;
    }

    return zf;
}